

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  pointer pbVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  TargetType targetType;
  int iVar7;
  cmGlobalNinjaGenerator *pcVar8;
  string *psVar9;
  cmValue cVar10;
  cmRulePlaceholderExpander *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  pointer s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string_view source;
  string lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string cmakeLinkVar;
  string responseFlag;
  string linkRuleName;
  string langFlags;
  string launcher;
  string linkerLauncher;
  string targetVersionMinor;
  string targetVersionMajor;
  string cmakeVarLang;
  ostringstream majorStream;
  cmNinjaRule rule;
  Names tgtNames;
  string cmakeCommand;
  string local_7c8;
  string local_7a8;
  string *local_778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_770;
  string local_758;
  char *local_738;
  char *local_730;
  char local_728;
  undefined7 uStack_727;
  string local_718;
  string local_6f8;
  char *local_6d8;
  undefined8 local_6d0;
  char local_6c8;
  undefined7 uStack_6c7;
  char *local_6b8;
  char *local_6b0;
  char local_6a8;
  undefined7 uStack_6a7;
  string local_698;
  char *local_678;
  undefined8 local_670;
  char local_668;
  undefined7 uStack_667;
  char *local_658;
  undefined8 local_650;
  char local_648;
  undefined7 uStack_647;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_638;
  undefined8 local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  char *local_618;
  char *local_610;
  char local_608;
  undefined7 uStack_607;
  undefined1 *puStack_600;
  char *local_5f8;
  char *local_5f0;
  char local_5e8;
  undefined7 uStack_5e7;
  undefined1 *puStack_5e0;
  string local_5d8;
  string local_5b8;
  undefined1 local_598 [32];
  _Alloc_hider local_578;
  undefined1 *local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  _Alloc_hider local_538;
  char *local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  _Alloc_hider local_518;
  size_type local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  _Alloc_hider local_4f8;
  size_type local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Alloc_hider local_4d8;
  size_type local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Alloc_hider local_4b8;
  size_type local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  size_type local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  bool local_478;
  undefined1 local_420 [32];
  _Alloc_hider local_400;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Alloc_hider local_360;
  char *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  char *local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  char *local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  bool local_300;
  undefined1 local_2f8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [12];
  undefined1 local_180 [32];
  char *local_160;
  char *local_158;
  pointer local_150;
  char *local_148;
  char *local_138;
  char *local_130;
  char *local_f8;
  char *local_e8;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_60;
  undefined4 extraout_var;
  
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  LanguageLinkerRule(&local_718,this,config);
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar6 = cmGlobalNinjaGenerator::HasRule(pcVar8,&local_718);
  sVar4 = local_718._M_string_length;
  if (!bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p == &local_718.field_2) {
      local_628._8_8_ = local_718.field_2._8_8_;
      local_638 = &local_628;
    }
    else {
      local_638 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_718._M_dataplus._M_p;
    }
    local_628._M_allocated_capacity._1_7_ = local_718.field_2._M_allocated_capacity._1_7_;
    local_628._M_local_buf[0] = local_718.field_2._M_local_buf[0];
    local_718._M_string_length = 0;
    local_718.field_2._M_local_buf[0] = '\0';
    local_420._0_8_ = local_420 + 0x10;
    if (local_638 == &local_628) {
      local_420._24_8_ = local_628._8_8_;
    }
    else {
      local_420._0_8_ = local_638;
    }
    local_420._16_8_ = local_628._M_allocated_capacity;
    local_400._M_p = (pointer)&local_3f0;
    local_420._8_8_ = sVar4;
    local_630 = 0;
    local_628._M_allocated_capacity =
         (ulong)(uint7)local_718.field_2._M_allocated_capacity._1_7_ << 8;
    local_3f8 = 0;
    local_3f0._M_local_buf[0] = '\0';
    local_3e0._M_p = (pointer)&local_3d0;
    local_3d8 = 0;
    local_3d0._M_local_buf[0] = '\0';
    local_3c0._M_p = (pointer)&local_3b0;
    local_3b8 = 0;
    local_3b0._M_local_buf[0] = '\0';
    local_3a0._M_p = (pointer)&local_390;
    local_398 = 0;
    local_390._M_local_buf[0] = '\0';
    local_380._M_p = (pointer)&local_370;
    local_378 = 0;
    local_370._M_local_buf[0] = '\0';
    local_360._M_p = (pointer)&local_350;
    local_358 = (char *)0x0;
    local_350._M_local_buf[0] = '\0';
    local_340._M_p = (pointer)&local_330;
    local_338 = (char *)0x0;
    local_330._M_local_buf[0] = '\0';
    local_320._M_p = (pointer)&local_310;
    local_318 = (char *)0x0;
    local_310._M_local_buf[0] = '\0';
    local_300 = false;
    local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
    local_638 = &local_628;
    memset(local_180,0,0x150);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_180._0_8_ = (psVar9->_M_dataplus)._M_p;
    psVar9 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_180._8_8_ = (psVar9->_M_dataplus)._M_p;
    cmGeneratorTarget::GetLinkerLanguage
              (&local_7c8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    local_150 = local_7c8._M_dataplus._M_p;
    local_148 = "$AIX_EXPORTS";
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)local_598,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    iVar7 = std::__cxx11::string::compare(local_598);
    pcVar11 = local_598 + 0x10;
    if ((char *)local_598._0_8_ != pcVar11) {
      operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
    }
    if (iVar7 == 0) {
      local_80 = "$SWIFT_LIBRARY_NAME";
      local_78 = "$SWIFT_MODULE";
      local_70 = "$SWIFT_MODULE_NAME";
      local_60 = "$SWIFT_SOURCES";
      local_a8 = "$DEFINES";
      local_e8 = "$FLAGS";
      local_a0 = "$INCLUDES";
    }
    local_738 = &local_728;
    local_730 = (char *)0x0;
    local_728 = '\0';
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)local_2f8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    local_598._0_8_ = (char *)0x6;
    local_598._8_8_ = "CMAKE_";
    local_598._16_8_ = local_2f8._8_8_;
    local_598._24_8_ = local_2f8._0_8_;
    views._M_len = 2;
    views._M_array = (iterator)local_598;
    cmCatViews_abi_cxx11_(&local_5b8,views);
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_758,local_5b8._M_dataplus._M_p,
               local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
    std::__cxx11::string::append((char *)&local_758);
    cVar10 = cmMakefile::GetDefinition
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                        &local_758);
    if (cVar10.Value == (string *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_738,0,local_730,0x7c1b05);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_738);
    }
    pcVar14 = "$LINK_PATH $LINK_LIBRARIES";
    lVar12 = 0x40;
    pcVar13 = "$in";
    if ((useResponseFile) && (local_730 != (char *)0x0)) {
      std::__cxx11::string::_M_replace((ulong)&local_360,0,local_358,0x7c1b42);
      std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_360._M_p);
      pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar13 = "$in_newline";
      if (pcVar8->UsingGCCOnWindows != false) {
        pcVar13 = "$in";
      }
      std::__cxx11::string::_M_replace((ulong)&local_340,0,local_338,(ulong)pcVar13);
      std::__cxx11::string::append((char *)&local_340);
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)local_598,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      iVar7 = std::__cxx11::string::compare(local_598);
      if ((char *)local_598._0_8_ != pcVar11) {
        operator_delete((void *)local_598._0_8_,(ulong)(local_598._16_8_ + 1));
      }
      lVar12 = 0x40;
      if (iVar7 == 0) {
        lVar12 = 0x120;
      }
      pcVar14 = "";
      pcVar13 = local_738;
    }
    *(char **)(local_180 + lVar12) = pcVar13;
    local_f8 = "$OBJECT_DIR";
    local_138 = "$TARGET_FILE";
    local_d8 = "$SONAME_FLAG";
    local_d0 = "$SONAME";
    local_c8 = "$INSTALLNAME_DIR";
    local_180._16_8_ = "$TARGET_PDB";
    local_658 = &local_648;
    local_650 = 0;
    local_648 = '\0';
    local_678 = &local_668;
    local_670 = 0;
    local_668 = '\0';
    local_130 = pcVar14;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               (int *)&local_6d8,(int *)&local_698);
    std::ostream::operator<<(local_598,(int)local_6d8);
    std::ostream::operator<<(local_2f8,(int)local_698._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_658,(string *)&local_7a8);
    paVar1 = &local_7a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,
                      CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                               local_7a8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_678,(string *)&local_7a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_7a8._M_dataplus._M_p,
                      CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                               local_7a8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
    std::ios_base::~ios_base((ios_base *)(local_2f8 + 0x70));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
    std::ios_base::~ios_base((ios_base *)local_528._M_local_buf);
    local_160 = local_658;
    local_158 = local_678;
    local_e8 = "$FLAGS";
    local_c0 = "$LINK_FLAGS";
    local_b8 = "$MANIFESTS";
    local_6d8 = &local_6c8;
    local_6d0 = 0;
    local_6c8 = '\0';
    if (targetType != EXECUTABLE) {
      std::__cxx11::string::append((char *)&local_6d8);
      local_b0 = local_6d8;
    }
    cmCommonTargetGenerator::GetLinkerLauncher(&local_698,(cmCommonTargetGenerator *)this,config);
    local_6b8 = &local_6a8;
    local_6b0 = (char *)0x0;
    local_6a8 = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_598._0_8_ = pcVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"RULE_LAUNCH_LINK","");
    psVar9 = (string *)
             cmLocalGenerator::GetRuleLauncher
                       ((cmLocalGenerator *)pcVar2,target,(string *)local_598);
    if ((char *)local_598._0_8_ != pcVar11) {
      operator_delete((void *)local_598._0_8_,(ulong)(local_598._16_8_ + 1));
    }
    if ((psVar9 != (string *)0x0) && (psVar9->_M_string_length != 0)) {
      if (psVar9 == (string *)0x0) {
        psVar9 = &cmValue::Empty_abi_cxx11_;
      }
      local_2f8._8_8_ = (psVar9->_M_dataplus)._M_p;
      local_2f8._0_8_ = psVar9->_M_string_length;
      local_598._0_8_ = &DAT_00000001;
      local_598[0x10] = 0x20;
      local_2f8._16_8_ = 1;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_2f8;
      local_598._8_8_ = pcVar11;
      local_2f8._24_8_ = pcVar11;
      cmCatViews_abi_cxx11_(&local_7a8,views_00);
      std::__cxx11::string::operator=((string *)&local_6b8,(string *)&local_7a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_7a8._M_dataplus._M_p,
                        CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                                 local_7a8.field_2._M_local_buf[0]) + 1);
      }
    }
    iVar7 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    this_00 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar7);
    local_778 = config;
    ComputeLinkCmd(&local_770,this,config);
    pbVar3 = local_770.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_770.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_770.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_770.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_598._24_8_ = (s->_M_dataplus)._M_p;
        local_598._16_8_ = s->_M_string_length;
        local_598._0_8_ = local_6b0;
        local_598._8_8_ = local_6b8;
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_598;
        cmCatViews_abi_cxx11_((string *)local_2f8,views_01);
        std::__cxx11::string::operator=((string *)s,(string *)local_2f8);
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
        }
        pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        outputConverter =
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
        if (pcVar2 == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_00,outputConverter,s,(RuleVariables *)local_180);
        s = s + 1;
      } while (s != pbVar3);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<cmNinjaRemoveNoOpCommands>>
                        (local_770.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_770.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    psVar9 = local_778;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_770,(iterator)__first._M_current,
               (iterator)
               local_770.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_598._0_8_ = local_598 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"$PRE_LINK","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&local_770,
                     (const_iterator)
                     local_770.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_598);
    if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
      operator_delete((void *)local_598._0_8_,(ulong)(local_598._16_8_ + 1));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_770,
               (char (*) [12])"$POST_BUILD");
    local_2f8._0_8_ = local_2f8 + 0x10;
    local_2f8._8_8_ = (char *)0x0;
    local_2f8._16_8_ = local_2f8._16_8_ & 0xffffffffffffff00;
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_598,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_770,
               psVar9,psVar9,(string *)local_2f8,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_400,(string *)local_598);
    if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
      operator_delete((void *)local_598._0_8_,(ulong)(local_598._16_8_ + 1));
    }
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_5d8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               psVar9);
    _Var5._M_p = local_5d8._M_dataplus._M_p;
    pcVar11 = GetVisibleTypeName(this);
    local_598._0_8_ = &DAT_00000011;
    local_598._8_8_ = "Rule for linking ";
    local_598._16_8_ = local_5d8._M_string_length;
    local_598._24_8_ = _Var5._M_p;
    local_2f8._0_8_ = &DAT_00000001;
    local_570 = local_2f8 + 0x10;
    local_2f8[0x10] = 0x20;
    local_578._M_p = &DAT_00000001;
    local_2f8._8_8_ = local_570;
    local_568._M_allocated_capacity = strlen(pcVar11);
    local_7a8._M_dataplus._M_p = &DAT_00000001;
    local_7a8.field_2._M_local_buf[0] = '.';
    local_558._M_p = &DAT_00000001;
    views_02._M_len = 5;
    views_02._M_array = (iterator)local_598;
    local_7a8._M_string_length = (size_type)&local_7a8.field_2;
    local_568._8_8_ = pcVar11;
    local_550 = &local_7a8.field_2;
    cmCatViews_abi_cxx11_(&local_6f8,views_02);
    std::__cxx11::string::operator=((string *)&local_3c0,(string *)&local_6f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_6f8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               local_778);
    _Var5._M_p = local_6f8._M_dataplus._M_p;
    pcVar11 = GetVisibleTypeName(this);
    local_598._0_8_ = (char *)0x8;
    local_598._8_8_ = "Linking ";
    local_598._16_8_ = local_6f8._M_string_length;
    local_598._24_8_ = _Var5._M_p;
    local_2f8._0_8_ = &DAT_00000001;
    local_570 = local_2f8 + 0x10;
    local_2f8[0x10] = 0x20;
    local_578._M_p = &DAT_00000001;
    local_2f8._8_8_ = local_570;
    local_568._M_allocated_capacity = strlen(pcVar11);
    local_558._M_p = (pointer)0xd;
    local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x7c2660;
    views_03._M_len = 5;
    views_03._M_array = (iterator)local_598;
    local_568._8_8_ = pcVar11;
    cmCatViews_abi_cxx11_(&local_7a8,views_03);
    std::__cxx11::string::operator=((string *)&local_3e0,(string *)&local_7a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p,
                      CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                               local_7a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_320,0,local_318,0x7c2264);
    config = local_778;
    pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar8,(cmNinjaRule *)local_420);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_770);
    if (this_00 != (cmRulePlaceholderExpander *)0x0) {
      (*(this_00->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_00);
    }
    if (local_6b8 != &local_6a8) {
      operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_698._M_dataplus._M_p._4_4_,(int)local_698._M_dataplus._M_p) !=
        &local_698.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_698._M_dataplus._M_p._4_4_,(int)local_698._M_dataplus._M_p),
                      local_698.field_2._M_allocated_capacity + 1);
    }
    if (local_6d8 != &local_6c8) {
      operator_delete(local_6d8,CONCAT71(uStack_6c7,local_6c8) + 1);
    }
    if (local_678 != &local_668) {
      operator_delete(local_678,CONCAT71(uStack_667,local_668) + 1);
    }
    if (local_658 != &local_648) {
      operator_delete(local_658,CONCAT71(uStack_647,local_648) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    if (local_738 != &local_728) {
      operator_delete(local_738,CONCAT71(uStack_727,local_728) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_420);
  }
  TargetNames((Names *)local_2f8,this,config);
  if (((local_2f8._40_8_ != local_2f8._72_8_) ||
      ((local_2f8._40_8_ != 0 &&
       (iVar7 = bcmp((void *)local_2f8._32_8_,(void *)local_2f8._64_8_,local_2f8._40_8_), iVar7 != 0
       )))) && (bVar6 = cmGeneratorTarget::IsFrameworkOnApple
                                  ((this->super_cmNinjaTargetGenerator).
                                   super_cmCommonTargetGenerator.GeneratorTarget), !bVar6)) {
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar9 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    source._M_str = (psVar9->_M_dataplus)._M_p;
    source._M_len = psVar9->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)local_180,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    if (targetType == EXECUTABLE) {
      local_5f8 = &local_5e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5f8,"CMAKE_SYMLINK_EXECUTABLE","");
      local_598._0_8_ = local_598 + 0x10;
      if (local_5f8 == &local_5e8) {
        local_598._24_8_ = puStack_5e0;
      }
      else {
        local_598._0_8_ = local_5f8;
      }
      local_598._17_7_ = uStack_5e7;
      local_598[0x10] = local_5e8;
      local_578._M_p = (pointer)&local_568;
      local_598._8_8_ = local_5f0;
      local_5f0 = (char *)0x0;
      local_5e8 = '\0';
      local_570 = (undefined1 *)0x0;
      local_568._M_allocated_capacity = local_568._M_allocated_capacity & 0xffffffffffffff00;
      local_558._M_p = (pointer)&local_548;
      local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_548._M_local_buf[0] = '\0';
      local_538._M_p = (pointer)&local_528;
      local_530 = (char *)0x0;
      local_528._M_local_buf[0] = '\0';
      local_518._M_p = (pointer)&local_508;
      local_510 = 0;
      local_508._M_local_buf[0] = '\0';
      local_4f8._M_p = (pointer)&local_4e8;
      local_4f0 = 0;
      local_4e8._M_local_buf[0] = '\0';
      local_4d8._M_p = (pointer)&local_4c8;
      local_4d0 = 0;
      local_4c8._M_local_buf[0] = '\0';
      local_4b8._M_p = (pointer)&local_4a8;
      local_4b0 = 0;
      local_4a8._M_local_buf[0] = '\0';
      local_498._M_p = (pointer)&local_488;
      local_490 = 0;
      local_488._M_local_buf[0] = '\0';
      local_478 = false;
      local_7c8.field_2._M_allocated_capacity = 0;
      local_7c8._M_dataplus._M_p = (pointer)0x0;
      local_7c8._M_string_length = 0;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_420 + 0x10);
      local_5f8 = &local_5e8;
      local_420._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_420,local_180._0_8_,(pointer)(local_180._8_8_ + local_180._0_8_));
      std::__cxx11::string::append(local_420);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._0_8_ != paVar1) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7c8,
                 (char (*) [12])"$POST_BUILD");
      local_7a8._M_string_length = 0;
      local_7a8.field_2._M_local_buf[0] = '\0';
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_420,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_7c8,config,config,&local_7a8,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_578,(string *)local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._0_8_ != paVar1) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,
                        CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                                 local_7a8.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_7c8);
      std::__cxx11::string::_M_replace((ulong)&local_558,0,(char *)local_550,0x7c24f9);
      std::__cxx11::string::_M_replace((ulong)&local_538,0,local_530,0x7c251a);
      pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar8,(cmNinjaRule *)local_598);
    }
    else {
      local_618 = &local_608;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_618,"CMAKE_SYMLINK_LIBRARY","");
      local_598._0_8_ = local_598 + 0x10;
      if (local_618 == &local_608) {
        local_598._24_8_ = puStack_600;
      }
      else {
        local_598._0_8_ = local_618;
      }
      local_598._17_7_ = uStack_607;
      local_598[0x10] = local_608;
      local_578._M_p = (pointer)&local_568;
      local_598._8_8_ = local_610;
      local_610 = (char *)0x0;
      local_608 = '\0';
      local_570 = (undefined1 *)0x0;
      local_568._M_allocated_capacity = local_568._M_allocated_capacity & 0xffffffffffffff00;
      local_558._M_p = (pointer)&local_548;
      local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_548._M_local_buf[0] = '\0';
      local_538._M_p = (pointer)&local_528;
      local_530 = (char *)0x0;
      local_528._M_local_buf[0] = '\0';
      local_518._M_p = (pointer)&local_508;
      local_510 = 0;
      local_508._M_local_buf[0] = '\0';
      local_4f8._M_p = (pointer)&local_4e8;
      local_4f0 = 0;
      local_4e8._M_local_buf[0] = '\0';
      local_4d8._M_p = (pointer)&local_4c8;
      local_4d0 = 0;
      local_4c8._M_local_buf[0] = '\0';
      local_4b8._M_p = (pointer)&local_4a8;
      local_4b0 = 0;
      local_4a8._M_local_buf[0] = '\0';
      local_498._M_p = (pointer)&local_488;
      local_490 = 0;
      local_488._M_local_buf[0] = '\0';
      local_478 = false;
      local_7c8.field_2._M_allocated_capacity = 0;
      local_7c8._M_dataplus._M_p = (pointer)0x0;
      local_7c8._M_string_length = 0;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_420 + 0x10);
      local_618 = &local_608;
      local_420._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_420,local_180._0_8_,(pointer)(local_180._8_8_ + local_180._0_8_));
      std::__cxx11::string::append(local_420);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._0_8_ != paVar1) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7c8,
                 (char (*) [12])"$POST_BUILD");
      local_7a8._M_string_length = 0;
      local_7a8.field_2._M_local_buf[0] = '\0';
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_420,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_7c8,config,config,&local_7a8,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_578,(string *)local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._0_8_ != paVar1) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,
                        CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                                 local_7a8.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_7c8);
      std::__cxx11::string::_M_replace((ulong)&local_558,0,(char *)local_550,0x7c2581);
      std::__cxx11::string::_M_replace((ulong)&local_538,0,local_530,0x7c259f);
      pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar8,(cmNinjaRule *)local_598);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_598);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
    }
  }
  if (local_258._M_p != local_2f8 + 0xb0) {
    operator_delete(local_258._M_p,local_248[0]._M_allocated_capacity + 1);
  }
  if (local_278._M_p != local_2f8 + 0x90) {
    operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2f8._96_8_ != local_2f8 + 0x70) {
    operator_delete((void *)local_2f8._96_8_,local_288._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2f8._64_8_ != local_2f8 + 0x50) {
    operator_delete((void *)local_2f8._64_8_,local_2f8._80_8_ + 1);
  }
  if ((undefined1 *)local_2f8._32_8_ != local_2f8 + 0x30) {
    operator_delete((void *)local_2f8._32_8_,local_2f8._48_8_ + 1);
  }
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,
                    CONCAT71(local_718.field_2._M_allocated_capacity._1_7_,
                             local_718.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
      if (this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    cmValue val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }
}